

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

int __thiscall QMessageBoxPrivate::dialogCode(QMessageBoxPrivate *this)

{
  ButtonRole BVar1;
  QMessageBoxPrivate *in_RDI;
  QMessageBox *q;
  QAbstractButton *in_stack_ffffffffffffffd8;
  int local_4;
  
  q_func(in_RDI);
  if ((in_RDI->super_QDialogPrivate).rescode < 2) {
    return (in_RDI->super_QDialogPrivate).rescode;
  }
  if (in_RDI->clickedButton == (QAbstractButton *)0x0) {
LAB_007a4420:
    local_4 = QDialogPrivate::dialogCode(&in_RDI->super_QDialogPrivate);
  }
  else {
    BVar1 = QMessageBox::buttonRole((QMessageBox *)in_RDI,in_stack_ffffffffffffffd8);
    switch(BVar1) {
    case AcceptRole:
    case YesRole:
      local_4 = 1;
      break;
    case RejectRole:
    case NoRole:
      local_4 = 0;
      break;
    default:
      goto LAB_007a4420;
    }
  }
  return local_4;
}

Assistant:

int QMessageBoxPrivate::dialogCode() const
{
    Q_Q(const QMessageBox);

    if (rescode <= QDialog::Accepted) {
        return rescode;
    } else if (clickedButton) {
        switch (q->buttonRole(clickedButton)) {
        case QMessageBox::AcceptRole:
        case QMessageBox::YesRole:
            return QDialog::Accepted;
        case QMessageBox::RejectRole:
        case QMessageBox::NoRole:
            return QDialog::Rejected;
        default:
            ;
        }
    }

    return QDialogPrivate::dialogCode();
}